

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O1

char * trim_extension(char *s)

{
  char *pcVar1;
  char buffer [4096];
  char acStack_1008 [4096];
  
  sprintf(acStack_1008,"%s%c",s,0);
  pcVar1 = strrchr(acStack_1008,0x2e);
  if ((pcVar1 != acStack_1008) && (pcVar1[-1] != '/')) {
    *pcVar1 = '\0';
  }
  pcVar1 = xstrdup(acStack_1008);
  return pcVar1;
}

Assistant:

const char *trim_extension(const char *s)
{
	char buffer[PATH_MAX];
	sprintf(&buffer[0], "%s%c", s, '\0');
	char *delim_pos = strrchr(buffer, '.');
	if (delim_pos == &buffer[0] || *(delim_pos - 1) == PATH_SEPARATOR) {
		return xstrdup(&buffer[0]);
	}
	*delim_pos = '\0';
	return xstrdup(&buffer[0]);
}